

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O2

bool __thiscall ON_NurbsCurve::MakeRational(ON_NurbsCurve *this)

{
  uint uVar1;
  uint uVar2;
  double *pdVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  double *pdVar7;
  double *pdVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (this->m_is_rat == 0) {
    uVar4 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])(this);
    uVar1 = this->m_cv_count;
    uVar10 = (ulong)uVar1;
    if ((0 < (int)uVar1) && (uVar2 = this->m_cv_stride, 0 < (int)uVar4 && (int)uVar4 <= (int)uVar2))
    {
      uVar6 = uVar4 + 1;
      if (uVar2 != uVar4) {
        uVar6 = uVar2;
      }
      ReserveCVCapacity(this,uVar6 * uVar1);
      pdVar3 = this->m_cv;
      lVar5 = (long)(int)uVar6;
      pdVar7 = pdVar3 + (uVar10 - 1) * lVar5 + -1;
      while (0 < (long)uVar10) {
        uVar10 = uVar10 - 1;
        pdVar8 = pdVar3 + (long)this->m_cv_stride * uVar10;
        if (pdVar3 == (double *)0x0) {
          pdVar8 = (double *)0x0;
        }
        for (uVar9 = (ulong)uVar4; 0 < (long)uVar9; uVar9 = uVar9 - 1) {
          pdVar7[uVar9] = pdVar8[uVar9 - 1];
        }
        pdVar3[uVar10 * lVar5 + (ulong)uVar4] = 1.0;
        pdVar7 = pdVar7 + -lVar5;
      }
      this->m_cv_stride = uVar6;
      this->m_is_rat = 1;
    }
  }
  return this->m_is_rat != 0;
}

Assistant:

bool ON_NurbsCurve::MakeRational()
{
  if ( !IsRational() ) {
    const int dim = Dimension();
    const int cv_count = CVCount();
    if ( cv_count > 0 && m_cv_stride >= dim && dim > 0 ) {
      const int new_stride = (m_cv_stride == dim) ? dim+1 : m_cv_stride;
      ReserveCVCapacity( cv_count*new_stride );
      const double* old_cv;
      double* new_cv;
      int cvi, j;
      for ( cvi = cv_count-1; cvi>=0; cvi-- ) {
        old_cv = CV(cvi);
        new_cv = m_cv+(cvi*new_stride);
        for ( j = dim-1; j >= 0; j-- ) {
          new_cv[j] = old_cv[j];
        }
        new_cv[dim] = 1.0;
      }
      m_cv_stride = new_stride;
      m_is_rat = 1;
    }
  }
  return IsRational();
}